

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileInfo.cpp
# Opt level: O2

void Js::DynamicProfileInfo::UpdateSourceDynamicProfileManagers(ScriptContext *scriptContext)

{
  SourceDynamicProfileManager *this;
  code *pcVar1;
  bool bVar2;
  LocalFunctionId functionId;
  undefined4 *puVar3;
  Type *pTVar4;
  FunctionBody *this_00;
  SourceContextInfo *pSVar5;
  SListBase<Js::DynamicProfileInfo_*,_Memory::Recycler,_RealCount> *pSVar6;
  SListNodeBase<Memory::Recycler> local_48;
  Iterator local_40;
  
  pSVar6 = (((scriptContext->super_ScriptContextBase).javascriptLibrary)->cache).profileInfoList.ptr
  ;
  local_40.list = pSVar6;
  local_40.current = &pSVar6->super_SListNodeBase<Memory::Recycler>;
  puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  while( true ) {
    if (pSVar6 == (SListBase<Js::DynamicProfileInfo_*,_Memory::Recycler,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                  ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
    }
    pSVar6 = local_40.list;
    SListNodeBase<Memory::Recycler>::Next(&local_48);
    if (local_48.next.ptr == (Type)pSVar6) break;
    SListNodeBase<Memory::Recycler>::Next(&local_48);
    local_40.current = (NodeBase *)local_48.next.ptr;
    pTVar4 = SListBase<Js::DynamicProfileInfo_*,_Memory::Recycler,_RealCount>::Iterator::Data
                       (&local_40);
    this_00 = GetFunctionBody(pTVar4->ptr);
    pSVar5 = FunctionProxy::GetSourceContextInfo((FunctionProxy *)this_00);
    this = (pSVar5->sourceDynamicProfileManager).ptr;
    functionId = FunctionProxy::GetLocalFunctionId((FunctionProxy *)this_00);
    SourceDynamicProfileManager::SaveDynamicProfileInfo(this,functionId,pTVar4->ptr);
    pSVar6 = (SListBase<Js::DynamicProfileInfo_*,_Memory::Recycler,_RealCount> *)local_40.current;
  }
  return;
}

Assistant:

void DynamicProfileInfo::UpdateSourceDynamicProfileManagers(ScriptContext * scriptContext)
    {
        // We don't clear old dynamic data here, because if a function is inlined, it will never go through the
        // EnsureDynamicProfileThunk and thus not appear in the list. We would want to keep those data as well.
        // Just save/update the data from function that has execute.

        // That means that the data will never go away, probably not a good policy if this is cached for web page in WININET.

        DynamicProfileInfoList * profileInfoList = scriptContext->GetProfileInfoList();
        FOREACH_SLISTBASE_ENTRY(DynamicProfileInfo * const, info, profileInfoList)
        {
            FunctionBody * functionBody = info->GetFunctionBody();
            SourceDynamicProfileManager * sourceDynamicProfileManager = functionBody->GetSourceContextInfo()->sourceDynamicProfileManager;
            sourceDynamicProfileManager->SaveDynamicProfileInfo(functionBody->GetLocalFunctionId(), info);
        }
        NEXT_SLISTBASE_ENTRY
    }